

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDScanState<float>::AlpRDScanState(AlpRDScanState<float> *this,ColumnSegment *segment)

{
  data_ptr_t pdVar1;
  uint *puVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  BufferManager *pBVar5;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__AlpRDScanState_019769e8;
  BufferHandle::BufferHandle(&this->handle);
  this->total_value_count = 0;
  this->segment = segment;
  this->count = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
                super___atomic_base<unsigned_long>._M_i;
  pBVar5 = BufferManager::GetBufferManager(segment->db);
  (*pBVar5->_vptr_BufferManager[7])(&BStack_38,pBVar5,&segment->block);
  BufferHandle::operator=(&this->handle,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar3 = ((this->handle).node.ptr)->buffer;
  iVar4 = segment->offset;
  pdVar1 = pdVar3 + iVar4;
  this->segment_data = pdVar1;
  puVar2 = (uint *)(pdVar3 + iVar4);
  this->metadata_ptr = pdVar1 + *puVar2;
  (this->vector_state).right_bit_width = (uint8_t)puVar2[1];
  (this->vector_state).left_bit_width = *(uint8_t *)((long)puVar2 + 5);
  switchD_00b041bd::default
            ((this->vector_state).left_parts_dict,(void *)((long)puVar2 + 7),
             (ulong)(byte)(*(char *)((long)puVar2 + 6) * '\x02'));
  return;
}

Assistant:

explicit AlpRDScanState(ColumnSegment &segment) : segment(segment), count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		segment_data = handle.Ptr() + segment.GetBlockOffset();
		auto metadata_offset = Load<uint32_t>(segment_data);
		metadata_ptr = segment_data + metadata_offset;

		// Load the Right Bit Width which is in the segment header after the pointer to the first metadata
		vector_state.right_bit_width = Load<uint8_t>(segment_data + AlpRDConstants::METADATA_POINTER_SIZE);
		vector_state.left_bit_width =
		    Load<uint8_t>(segment_data + AlpRDConstants::METADATA_POINTER_SIZE + AlpRDConstants::RIGHT_BIT_WIDTH_SIZE);

		uint8_t actual_dictionary_size =
		    Load<uint8_t>(segment_data + AlpRDConstants::METADATA_POINTER_SIZE + AlpRDConstants::RIGHT_BIT_WIDTH_SIZE +
		                  AlpRDConstants::LEFT_BIT_WIDTH_SIZE);
		uint8_t actual_dictionary_size_bytes = actual_dictionary_size * AlpRDConstants::DICTIONARY_ELEMENT_SIZE;

		// Load the left parts dictionary which is after the segment header and is of a fixed size
		memcpy(vector_state.left_parts_dict, (void *)(segment_data + AlpRDConstants::HEADER_SIZE),
		       actual_dictionary_size_bytes);
	}